

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_Test1DLinearResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DLinearResourceMips_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar3;
  ulong uVar4;
  AssertHelper local_2d0;
  Message local_2c8;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_7;
  Message local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_6;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_5;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  uint local_1d0;
  uint local_1cc;
  int mip_1;
  uint32_t StartOfMip;
  Message local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_3;
  Message local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148 [3];
  undefined4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint32_t AlignedSize;
  uint32_t PitchInBytes;
  int mip;
  uint32_t AlignedWidth;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t HAlign;
  CTestGen9Resource_Test1DLinearResourceMips_Test *this_local;
  
  gmmParams.MultiTileArch.Reserved = 0x40;
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_16;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xfffffffffff7ffff | 0x80000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  gmmParams.BaseHeight = 5;
  for (ResourceInfo._4_4_ = TEST_BPP_8; ResourceInfo._4_4_ < TEST_BPP_MAX;
      ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 0x100;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&bpp);
    PitchInBytes = (gmmParams.CpTag + 0x3f) - (gmmParams.CpTag + 0x3f & 0x3f);
    for (AlignedSize = 1; AlignedSize <= gmmParams.BaseHeight; AlignedSize = AlignedSize + 1) {
      PitchInBytes = PitchInBytes +
                     (((int)((ulong)gmmParams._40_8_ >> ((byte)AlignedSize & 0x3f)) + 0x3f) -
                     ((int)((ulong)gmmParams._40_8_ >> ((byte)AlignedSize & 0x3f)) + 0x3fU & 0x3f));
    }
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo._4_4_);
    OffsetInfo.StdLayout.TileDepthPitch._4_4_ = PitchInBytes * uVar2;
    OffsetInfo.StdLayout.TileDepthPitch._0_4_ =
         OffsetInfo.StdLayout.TileDepthPitch._4_4_ + 0xfffU & 0xfffff000;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo_00,0x40);
    CTestResource::VerifyResourceVAlign<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourcePitch<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourcePitchInTiles<false>((CTestResource *)this,ResourceInfo_00,0);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo_00,
               (ulong)(uint)OffsetInfo.StdLayout.TileDepthPitch);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,ResourceInfo_00,0);
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    OffsetInfo.Render.field_0.Offset64 = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset64 = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    OffsetInfo._0_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&gtest_ar.message_);
    local_12c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_128,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_12c
               ,&OffsetInfo.Lock.Pitch);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(local_148);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_148);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    local_164 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_160,"0",(int *)"OffsetInfo.Render.XOffset",&local_164,
               &OffsetInfo.Render);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    local_18c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_188,"0",(int *)"OffsetInfo.Render.YOffset",&local_18c,
               (type *)((long)&OffsetInfo.Render.field_0 + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xde,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    local_1b4 = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_1b0,"0",(int *)"OffsetInfo.Render.ZOffset",&local_1b4,
               &OffsetInfo.Render.XOffset);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mip_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0xdf,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mip_1,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mip_1);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    local_1cc = 0;
    for (local_1d0 = 1; local_1d0 <= gmmParams.BaseHeight; local_1d0 = local_1d0 + 1) {
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      OffsetInfo.MipLevel = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo._0_4_ = local_1d0;
      (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&gtest_ar.message_);
      uVar4 = (ulong)gmmParams._40_8_ >> ((char)local_1d0 - 1U & 0x3f);
      uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo._4_4_);
      local_1cc = local_1cc + ((int)uVar4 + 0x3fU & 0xffffffc0) * uVar2;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_248,"StartOfMip","OffsetInfo.Render.Offset64",&local_1cc,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xea,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_250);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      local_26c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_268,"0",(int *)"OffsetInfo.Render.XOffset",&local_26c,
                 &OffsetInfo.Render);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_278);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xeb,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_278);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_278);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      local_294 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_290,"0",(int *)"OffsetInfo.Render.YOffset",&local_294,
                 (type *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xec,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_2a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
      local_2bc = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_2b8,"0",(int *)"OffsetInfo.Render.ZOffset",&local_2bc,
                 &OffsetInfo.Render.XOffset);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xed,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        testing::Message::~Message(&local_2c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DLinearResourceMips)
{
    // Horizontal pixel alignment
    const uint32_t HAlign = 64;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate 256x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x100;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, HAlign);
        }
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // Mip0 should be at offset 0. X/Y/Z Offset should be 0 for linear.
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // All mips should be right after one another linearly
        uint32_t StartOfMip = 0;
        for(int mip = 1; mip <= gmmParams.MaxLod; mip++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), HAlign) * GetBppValue(bpp);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}